

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O1

int ShouldMergeBlock(uint8_t *data,size_t len,uint8_t *depths)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double __x;
  size_t histo [256];
  ulong local_828 [256];
  
  memset(local_828,0,0x800);
  if (len != 0) {
    uVar2 = 0;
    do {
      local_828[data[uVar2]] = local_828[data[uVar2]] + 1;
      uVar2 = uVar2 + 0x2b;
    } while (uVar2 < len);
  }
  uVar2 = (len + 0x2a) / 0x2b;
  if (len + 0x2a < 0x2b00) {
    dVar6 = kLog2Table[uVar2];
  }
  else {
    dVar6 = log2((double)uVar2);
  }
  dVar6 = (double)uVar2 * (dVar6 + 0.5) + 200.0;
  lVar3 = 0;
  do {
    uVar2 = local_828[lVar3];
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    __x = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    bVar1 = depths[lVar3];
    if (uVar2 < 0x100) {
      dVar4 = kLog2Table[uVar2];
    }
    else {
      dVar4 = log2(__x);
    }
    dVar6 = dVar6 - __x * ((double)bVar1 + dVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return (int)(0.0 <= dVar6);
}

Assistant:

static BROTLI_BOOL ShouldMergeBlock(
    const uint8_t* data, size_t len, const uint8_t* depths) {
  size_t histo[256] = { 0 };
  static const size_t kSampleRate = 43;
  size_t i;
  for (i = 0; i < len; i += kSampleRate) {
    ++histo[data[i]];
  }
  {
    const size_t total = (len + kSampleRate - 1) / kSampleRate;
    double r = (FastLog2(total) + 0.5) * (double)total + 200;
    for (i = 0; i < 256; ++i) {
      r -= (double)histo[i] * (depths[i] + FastLog2(histo[i]));
    }
    return TO_BROTLI_BOOL(r >= 0.0);
  }
}